

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_tokenizer.cc
# Opt level: O3

int main(int argc,char **argv)

{
  _Alloc_hider _Var1;
  bool include_ignorable;
  char cVar2;
  int iVar3;
  uint uVar4;
  char *pcVar5;
  FileInputSource *this;
  BufferInputSource *pBVar6;
  long *plVar7;
  undefined8 extraout_RAX;
  ostream *poVar8;
  char *pcVar9;
  size_type *psVar10;
  int extraout_EDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  int iVar11;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var12;
  Pipeline *pPVar13;
  bool bVar14;
  Pl_Buffer plb;
  QPDF qpdf;
  shared_ptr<Buffer> b;
  shared_ptr<Buffer> content_data;
  string local_148;
  string local_128;
  QPDF local_f0 [8];
  Buffer *local_e8;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_e0;
  undefined4 local_d8;
  undefined1 uStack_d4;
  undefined1 uStack_d3;
  undefined2 uStack_d2;
  ulong local_c8;
  Buffer *local_c0;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_b8;
  Pipeline *local_b0;
  Pipeline *local_a8;
  shared_ptr<InputSource> local_98;
  shared_ptr<InputSource> local_88;
  shared_ptr<InputSource> local_78;
  Pipeline *local_68;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_58;
  string local_50 [8];
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_48;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_38;
  
  QUtil::setLineBuf(_stdout);
  pcVar9 = *argv;
  pcVar5 = strrchr(pcVar9,0x2f);
  whoami = pcVar5 + 1;
  if (pcVar5 == (char *)0x0) {
    whoami = pcVar9;
  }
  if (1 < argc) {
    include_ignorable = true;
    iVar11 = 1;
    local_c8 = 0;
    pcVar9 = (char *)0x0;
    do {
      pcVar5 = argv[iVar11];
      if (*pcVar5 == '-') {
        iVar3 = strcmp(pcVar5,"-maxlen");
        if (iVar3 == 0) {
          iVar11 = iVar11 + 1;
          if (argc <= iVar11) goto LAB_001050d6;
          uVar4 = QUtil::string_to_uint(argv[iVar11]);
          local_c8 = (ulong)uVar4;
          pcVar5 = pcVar9;
        }
        else {
          iVar3 = strcmp(pcVar5,"-no-ignorable");
          if (iVar3 != 0) goto LAB_001050d6;
          include_ignorable = false;
          pcVar5 = pcVar9;
        }
      }
      else if (pcVar9 != (char *)0x0) goto LAB_001050d6;
      iVar11 = iVar11 + 1;
      pcVar9 = pcVar5;
    } while (iVar11 < argc);
    if (pcVar5 != (char *)0x0) {
      this = (FileInputSource *)operator_new(0xd8);
      FileInputSource::FileInputSource(this,pcVar5);
      local_128._M_dataplus._M_p = (pointer)this;
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::__shared_count<FileInputSource*>
                ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&local_128._M_string_length,this);
      this_00 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_128._M_string_length;
      local_78.super___shared_ptr<InputSource,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)local_128._M_dataplus._M_p;
      local_78.super___shared_ptr<InputSource,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
           (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_128._M_string_length;
      if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_128._M_string_length !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          *(_Atomic_word *)(local_128._M_string_length + 8) =
               *(_Atomic_word *)(local_128._M_string_length + 8) + 1;
          UNLOCK();
        }
        else {
          *(_Atomic_word *)(local_128._M_string_length + 8) =
               *(_Atomic_word *)(local_128._M_string_length + 8) + 1;
        }
      }
      local_128._M_string_length = 4;
      local_128.field_2._M_allocated_capacity._0_5_ = 0x454c4946;
      local_128._M_dataplus._M_p = (pointer)&local_128.field_2;
      dump_tokens(&local_78,&local_128,local_c8,include_ignorable,true,false);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_128._M_dataplus._M_p != &local_128.field_2) {
        operator_delete(local_128._M_dataplus._M_p,local_128.field_2._M_allocated_capacity + 1);
      }
      if (local_78.super___shared_ptr<InputSource,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  (local_78.super___shared_ptr<InputSource,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                   _M_pi);
      }
      QPDF::QPDF(local_f0);
      QPDF::processFile((char *)local_f0,pcVar5);
      QPDFPageDocumentHelper::QPDFPageDocumentHelper((QPDFPageDocumentHelper *)&local_128,local_f0);
      QPDFPageDocumentHelper::getAllPages();
      QPDFPageDocumentHelper::~QPDFPageDocumentHelper((QPDFPageDocumentHelper *)&local_128);
      local_68 = local_a8;
      if (local_b0 != local_a8) {
        iVar11 = 1;
        p_Var12 = this_00;
        pPVar13 = local_b0;
        do {
          Pl_Buffer::Pl_Buffer((Pl_Buffer *)&local_128,"buffer",(Pipeline *)0x0);
          QPDFPageObjectHelper::pipeContents(pPVar13);
          Pl_Buffer::getBufferSharedPointer();
          pBVar6 = (BufferInputSource *)operator_new(0xe8);
          local_148.field_2._M_allocated_capacity = 0x20746e65746e6f63;
          local_148._M_string_length = 0xc;
          local_148.field_2._8_5_ = 0x61746164;
          local_148._M_dataplus._M_p = (pointer)&local_148.field_2;
          BufferInputSource::BufferInputSource(pBVar6,(string *)&local_148,local_c0,false);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_148._M_dataplus._M_p != &local_148.field_2) {
            operator_delete(local_148._M_dataplus._M_p,local_148.field_2._M_allocated_capacity + 1);
          }
          local_148._M_dataplus._M_p = (pointer)pBVar6;
          std::__shared_count<(__gnu_cxx::_Lock_policy)2>::__shared_count<BufferInputSource*>
                    ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&local_148._M_string_length,
                     pBVar6);
          this_00 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_148._M_string_length;
          _Var1._M_p = local_148._M_dataplus._M_p;
          local_148._M_dataplus._M_p = (pointer)0x0;
          local_148._M_string_length = 0;
          if ((p_Var12 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) &&
             (std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var12),
             (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_148._M_string_length !=
             (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0)) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_148._M_string_length);
          }
          local_88.super___shared_ptr<InputSource,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
               (element_type *)_Var1._M_p;
          local_88.super___shared_ptr<InputSource,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
               this_00;
          if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            if (__libc_single_threaded == '\0') {
              LOCK();
              *(_Atomic_word *)((long)this_00 + 8) = *(_Atomic_word *)((long)this_00 + 8) + 1;
              UNLOCK();
            }
            else {
              *(_Atomic_word *)((long)this_00 + 8) = *(_Atomic_word *)((long)this_00 + 8) + 1;
            }
          }
          QUtil::int_to_string_abi_cxx11_((longlong)&local_e8,iVar11);
          plVar7 = (long *)std::__cxx11::string::replace((ulong)&local_e8,0,(char *)0x0,0x10708f);
          p_Var12 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(plVar7 + 2);
          if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)*plVar7 == p_Var12) {
            local_148.field_2._M_allocated_capacity = (size_type)p_Var12->_vptr__Sp_counted_base;
            local_148.field_2._8_8_ = plVar7[3];
            local_148._M_dataplus._M_p = (pointer)&local_148.field_2;
          }
          else {
            local_148.field_2._M_allocated_capacity = (size_type)p_Var12->_vptr__Sp_counted_base;
            local_148._M_dataplus._M_p = (pointer)*plVar7;
          }
          local_148._M_string_length = plVar7[1];
          *plVar7 = (long)p_Var12;
          plVar7[1] = 0;
          *(undefined1 *)(plVar7 + 2) = 0;
          dump_tokens(&local_88,&local_148,local_c8,include_ignorable,false,true);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_148._M_dataplus._M_p != &local_148.field_2) {
            operator_delete(local_148._M_dataplus._M_p,local_148.field_2._M_allocated_capacity + 1);
          }
          if (local_e8 != (Buffer *)&local_d8) {
            operator_delete(local_e8,CONCAT26(uStack_d2,
                                              CONCAT15(uStack_d3,CONCAT14(uStack_d4,local_d8))) + 1)
            ;
          }
          if (local_88.super___shared_ptr<InputSource,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
              != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      (local_88.super___shared_ptr<InputSource,_(__gnu_cxx::_Lock_policy)2>.
                       _M_refcount._M_pi);
          }
          if (local_b8 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_b8);
          }
          Pl_Buffer::~Pl_Buffer((Pl_Buffer *)&local_128);
          pPVar13 = pPVar13 + 0x38;
          iVar11 = iVar11 + 1;
          p_Var12 = this_00;
        } while (pPVar13 != local_68);
      }
      std::vector<QPDFPageObjectHelper,_std::allocator<QPDFPageObjectHelper>_>::~vector
                ((vector<QPDFPageObjectHelper,_std::allocator<QPDFPageObjectHelper>_> *)&local_b0);
      QPDF::getAllObjects();
      if (local_b0 != local_a8) {
        p_Var12 = this_00;
        pPVar13 = local_b0;
        do {
          cVar2 = QPDFObjectHandle::isStream();
          this_00 = p_Var12;
          if (cVar2 != '\0') {
            QPDFObjectHandle::getDict();
            local_128._M_dataplus._M_p = (pointer)&local_128.field_2;
            local_128._M_string_length = 5;
            local_128.field_2._M_allocated_capacity._0_6_ = 0x657079542f;
            QPDFObjectHandle::getKey((string *)&local_c0);
            cVar2 = QPDFObjectHandle::isName();
            if (cVar2 == '\0') {
              bVar14 = false;
            }
            else {
              QPDFObjectHandle::getDict();
              local_e8 = (Buffer *)&local_d8;
              uStack_d4 = 0x65;
              local_d8 = 0x7079542f;
              local_e0 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x5;
              uStack_d3 = 0;
              QPDFObjectHandle::getKey(local_50);
              QPDFObjectHandle::getName_abi_cxx11_();
              iVar11 = std::__cxx11::string::compare((char *)&local_148);
              bVar14 = iVar11 == 0;
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_148._M_dataplus._M_p != &local_148.field_2) {
                operator_delete(local_148._M_dataplus._M_p,
                                local_148.field_2._M_allocated_capacity + 1);
              }
              if (local_48 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_48);
              }
              if (local_e8 != (Buffer *)&local_d8) {
                operator_delete(local_e8,CONCAT26(uStack_d2,
                                                  CONCAT15(uStack_d3,CONCAT14(uStack_d4,local_d8)))
                                         + 1);
              }
              if (local_58 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_58);
              }
            }
            if (local_b8 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_b8);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_128._M_dataplus._M_p != &local_128.field_2) {
              operator_delete(local_128._M_dataplus._M_p,local_128.field_2._M_allocated_capacity + 1
                             );
            }
            if (local_38 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_38);
            }
            if (bVar14) {
              QPDFObjectHandle::getStreamData((qpdf_stream_decode_level_e)&local_e8);
              pBVar6 = (BufferInputSource *)operator_new(0xe8);
              local_128._M_dataplus._M_p = (pointer)&local_128.field_2;
              local_148._M_dataplus._M_p = (pointer)0x12;
              local_128._M_dataplus._M_p =
                   (pointer)std::__cxx11::string::_M_create((ulong *)&local_128,(ulong)&local_148);
              local_128.field_2._M_allocated_capacity = (size_type)local_148._M_dataplus._M_p;
              builtin_strncpy(local_128._M_dataplus._M_p,"object stream data",0x12);
              local_128._M_string_length = (size_type)local_148._M_dataplus._M_p;
              local_128._M_dataplus._M_p[(long)local_148._M_dataplus._M_p] = '\0';
              BufferInputSource::BufferInputSource(pBVar6,(string *)&local_128,local_e8,false);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_128._M_dataplus._M_p != &local_128.field_2) {
                operator_delete(local_128._M_dataplus._M_p,
                                (ulong)(local_128.field_2._M_allocated_capacity + 1));
              }
              local_128._M_dataplus._M_p = (pointer)pBVar6;
              std::__shared_count<(__gnu_cxx::_Lock_policy)2>::__shared_count<BufferInputSource*>
                        ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&local_128._M_string_length,
                         pBVar6);
              this_00 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_128._M_string_length;
              _Var1._M_p = local_128._M_dataplus._M_p;
              local_128._M_dataplus._M_p = (pointer)0x0;
              local_128._M_string_length = 0;
              if ((p_Var12 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) &&
                 (std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var12),
                 (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_128._M_string_length !=
                 (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0)) {
                std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                          ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                           local_128._M_string_length);
              }
              local_98.super___shared_ptr<InputSource,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
                   (element_type *)_Var1._M_p;
              local_98.super___shared_ptr<InputSource,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
                   = this_00;
              if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                if (__libc_single_threaded == '\0') {
                  LOCK();
                  *(_Atomic_word *)((long)this_00 + 8) = *(_Atomic_word *)((long)this_00 + 8) + 1;
                  UNLOCK();
                }
                else {
                  *(_Atomic_word *)((long)this_00 + 8) = *(_Atomic_word *)((long)this_00 + 8) + 1;
                }
              }
              iVar11 = QPDFObjectHandle::getObjectID();
              QUtil::int_to_string_abi_cxx11_((longlong)&local_148,iVar11);
              plVar7 = (long *)std::__cxx11::string::replace
                                         ((ulong)&local_148,0,(char *)0x0,0x1070b6);
              psVar10 = (size_type *)(plVar7 + 2);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)*plVar7 ==
                  (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)psVar10) {
                local_128.field_2._M_allocated_capacity = *psVar10;
                local_128.field_2._8_8_ = plVar7[3];
                local_128._M_dataplus._M_p = (pointer)&local_128.field_2;
              }
              else {
                local_128.field_2._M_allocated_capacity = *psVar10;
                local_128._M_dataplus._M_p = (pointer)*plVar7;
              }
              local_128._M_string_length = plVar7[1];
              *plVar7 = (long)psVar10;
              plVar7[1] = 0;
              *(undefined1 *)(plVar7 + 2) = 0;
              dump_tokens(&local_98,&local_128,local_c8,include_ignorable,false,false);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_128._M_dataplus._M_p != &local_128.field_2) {
                operator_delete(local_128._M_dataplus._M_p,
                                local_128.field_2._M_allocated_capacity + 1);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_148._M_dataplus._M_p != &local_148.field_2) {
                operator_delete(local_148._M_dataplus._M_p,
                                local_148.field_2._M_allocated_capacity + 1);
              }
              if (local_98.super___shared_ptr<InputSource,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                  _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                          (local_98.super___shared_ptr<InputSource,_(__gnu_cxx::_Lock_policy)2>.
                           _M_refcount._M_pi);
              }
              if (local_e0 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_e0);
              }
            }
          }
          pPVar13 = pPVar13 + 0x10;
          p_Var12 = this_00;
        } while (pPVar13 != local_a8);
      }
      std::vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>::~vector
                ((vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_> *)&local_b0);
      QPDF::~QPDF(local_f0);
      if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
      }
      return 0;
    }
  }
LAB_001050d6:
  usage();
  QPDF::~QPDF(local_f0);
  if (argv != (char **)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)argv);
  }
  if (extraout_EDX != 1) {
    _Unwind_Resume(extraout_RAX);
  }
  plVar7 = (long *)__cxa_begin_catch(extraout_RAX);
  poVar8 = std::operator<<((ostream *)&std::cerr,whoami);
  std::__ostream_insert<char,std::char_traits<char>>(poVar8,": exception: ",0xd);
  pcVar9 = (char *)(**(code **)(*plVar7 + 0x10))(plVar7);
  std::operator<<(poVar8,pcVar9);
  exit(2);
}

Assistant:

int
main(int argc, char* argv[])
{
    QUtil::setLineBuf(stdout);
    if ((whoami = strrchr(argv[0], '/')) == nullptr) {
        whoami = argv[0];
    } else {
        ++whoami;
    }

    char const* filename = nullptr;
    size_t max_len = 0;
    bool include_ignorable = true;
    for (int i = 1; i < argc; ++i) {
        if (argv[i][0] == '-') {
            if (strcmp(argv[i], "-maxlen") == 0) {
                if (++i >= argc) {
                    usage();
                }
                max_len = QUtil::string_to_uint(argv[i]);
            } else if (strcmp(argv[i], "-no-ignorable") == 0) {
                include_ignorable = false;
            } else {
                usage();
            }
        } else if (filename) {
            usage();
        } else {
            filename = argv[i];
        }
    }
    if (filename == nullptr) {
        usage();
    }

    try {
        process(filename, include_ignorable, max_len);
    } catch (std::exception& e) {
        std::cerr << whoami << ": exception: " << e.what();
        exit(2);
    }
    return 0;
}